

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O1

int sat_solver_count_assigned(sat_solver *s)

{
  int iVar1;
  long lVar2;
  
  if ((s->trail_lim).size != 0) {
    __assert_fail("sat_solver_dl(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x2ea,"int sat_solver_count_assigned(sat_solver *)");
  }
  if ((long)s->size < 1) {
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)(s->assigns[lVar2] != '\x03');
      lVar2 = lVar2 + 1;
    } while (s->size != lVar2);
  }
  return iVar1;
}

Assistant:

int sat_solver_count_assigned(sat_solver* s)
{
    // count top-level assignments
    int i, Count = 0;
    assert(sat_solver_dl(s) == 0);
    for ( i = 0; i < s->size; i++ )
        if (var_value(s, i) != varX)
            Count++;
    return Count;
}